

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O3

void __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,QDBusPlatformMenu *menu,int depth,QStringList *propertyNames)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 *local_80;
  QVariantMap local_78;
  QArrayDataPointer<QDBusMenuLayoutItem> QStack_70;
  QArrayData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusPlatformMenu::items(menu);
  puVar1 = puStack_50;
  if (local_48 != (undefined1 *)0x0) {
    lVar2 = (long)local_48 << 3;
    lVar3 = 0;
    do {
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_70.ptr = (QDBusMenuLayoutItem *)0x0;
      QStack_70.size = 0;
      local_78.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
              )0x0;
      QStack_70.d = (Data *)0x0;
      populate((QDBusMenuLayoutItem *)&local_80,*(QDBusPlatformMenuItem **)(puVar1 + lVar3),
               depth + -1,propertyNames);
      QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
                ((QMovableArrayOps<QDBusMenuLayoutItem> *)&this->m_children,
                 (this->m_children).d.size,(QDBusMenuLayoutItem *)&local_80);
      QList<QDBusMenuLayoutItem>::end(&this->m_children);
      QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&QStack_70);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_78.d);
      lVar3 = lVar3 + 8;
    } while (lVar2 != lVar3);
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuLayoutItem::populate(const QDBusPlatformMenu *menu, int depth, const QStringList &propertyNames)
{
    const auto items = menu->items();
    for (QDBusPlatformMenuItem *item : items) {
        QDBusMenuLayoutItem child;
        child.populate(item, depth - 1, propertyNames);
        m_children << child;
    }
}